

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Partition::AddChildObject(Partition *this,InterchangeObject *Object)

{
  bool bVar1;
  PacketList *this_00;
  InterchangeObject *Object_local;
  Partition *this_local;
  
  if (Object != (InterchangeObject *)0x0) {
    bVar1 = Kumu::Identifier<16U>::HasValue(&(Object->InstanceUID).super_Identifier<16U>);
    if (!bVar1) {
      Kumu::GenRandomValue(&Object->InstanceUID);
    }
    this_00 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->(&this->m_PacketList);
    PacketList::AddPacket(this_00,Object);
    return;
  }
  __assert_fail("Object",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp",
                300,"virtual void ASDCP::MXF::Partition::AddChildObject(InterchangeObject *)");
}

Assistant:

void
ASDCP::MXF::Partition::AddChildObject(InterchangeObject* Object)
{
  assert(Object);

  if ( ! Object->InstanceUID.HasValue() )
    GenRandomValue(Object->InstanceUID);

  m_PacketList->AddPacket(Object);
}